

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_estimateDStreamSize_fromFrame(void *src,size_t srcSize)

{
  size_t blockSize;
  ulong uVar1;
  size_t sStack_40;
  ZSTD_frameHeader zfh;
  
  sStack_40 = ZSTD_getFrameHeader(&zfh,src,srcSize);
  if (sStack_40 < 0xffffffffffffff89) {
    if (sStack_40 == 0) {
      if (zfh.windowSize < 0x80000001) {
        uVar1 = 0x20000;
        if (zfh.windowSize < 0x20000) {
          uVar1 = zfh.windowSize;
        }
        sStack_40 = uVar1 + zfh.windowSize + (uVar1 & 0xffffffff) * 2 + 0x17728;
      }
      else {
        sStack_40 = 0xfffffffffffffff0;
      }
    }
    else {
      sStack_40 = 0xffffffffffffffb8;
    }
  }
  return sStack_40;
}

Assistant:

size_t ZSTD_estimateDStreamSize_fromFrame(const void* src, size_t srcSize)
{
    U32 const windowSizeMax = 1U << ZSTD_WINDOWLOG_MAX;   /* note : should be user-selectable, but requires an additional parameter (or a dctx) */
    ZSTD_frameHeader zfh;
    size_t const err = ZSTD_getFrameHeader(&zfh, src, srcSize);
    if (ZSTD_isError(err)) return err;
    RETURN_ERROR_IF(err>0, srcSize_wrong, "");
    RETURN_ERROR_IF(zfh.windowSize > windowSizeMax,
                    frameParameter_windowTooLarge, "");
    return ZSTD_estimateDStreamSize((size_t)zfh.windowSize);
}